

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c++
# Opt level: O2

longlong kj::anon_unknown_39::parseSigned(StringPtr *s,longlong min,longlong max)

{
  bool bVar1;
  int *piVar2;
  Fault *this;
  char *pcVar3;
  int iVar4;
  Fault f_1;
  longlong value;
  char *endPtr;
  longlong max_local;
  longlong min_local;
  
  this = &f_1;
  max_local = max;
  min_local = min;
  if ((s->content).size_ < 2) {
    pcVar3 = "s != nullptr";
    this = (Fault *)&endPtr;
    iVar4 = 0x2c;
  }
  else {
    piVar2 = __errno_location();
    *piVar2 = 0;
    pcVar3 = (s->content).ptr;
    bVar1 = isHex(pcVar3);
    iVar4 = 10;
    if (bVar1) {
      iVar4 = 0x10;
    }
    value = strtoll(pcVar3,&endPtr,iVar4);
    if (endPtr == (s->content).ptr + ((s->content).size_ - 1)) {
      if (*piVar2 == 0x22) {
        _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[19],kj::StringPtr_const&>
                  (&f_1,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/string.c++"
                   ,0x31,FAILED,"errno != ERANGE","\"Value out-of-range\", s",
                   (char (*) [19])"Value out-of-range",s);
      }
      else {
        if ((min <= value) && (value <= max)) {
          return value;
        }
        _::Debug::Fault::
        Fault<kj::Exception::Type,char_const(&)[19],long_long&,long_long&,long_long&>
                  (&f_1,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/string.c++"
                   ,0x32,FAILED,"value >= min && value <= max",
                   "\"Value out-of-range\", value, min, max",(char (*) [19])"Value out-of-range",
                   &value,&min_local,&max_local);
        this = &f_1;
      }
      goto LAB_00303c0c;
    }
    pcVar3 = "endPtr == s.end()";
    iVar4 = 0x30;
    this = &f_1;
  }
  _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[37],kj::StringPtr_const&>
            (this,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/string.c++"
             ,iVar4,FAILED,pcVar3,"\"String does not contain valid number\", s",
             (char (*) [37])"String does not contain valid number",s);
LAB_00303c0c:
  _::Debug::Fault::~Fault(this);
  return 0;
}

Assistant:

long long parseSigned(const StringPtr& s, long long min, long long max) {
  KJ_REQUIRE(s != nullptr, "String does not contain valid number", s) { return 0; }
  char *endPtr;
  errno = 0;
  auto value = strtoll(s.begin(), &endPtr, isHex(s.cStr()) ? 16 : 10);
  KJ_REQUIRE(endPtr == s.end(), "String does not contain valid number", s) { return 0; }
  KJ_REQUIRE(errno != ERANGE, "Value out-of-range", s) { return 0; }
  KJ_REQUIRE(value >= min && value <= max, "Value out-of-range", value, min, max) { return 0; }
  return value;
}